

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assessment_1.cpp
# Opt level: O0

void change_light(vec3 *dir_list,vec3 *c_list,int light_n,float *dir,float *c)

{
  float *c_local;
  float *dir_local;
  int light_n_local;
  vec3 *c_list_local;
  vec3 *dir_list_local;
  
  dir_list[light_n][0] = *dir;
  dir_list[light_n][1] = dir[1];
  dir_list[light_n][2] = dir[2];
  c_list[light_n][0] = *c;
  c_list[light_n][1] = c[1];
  c_list[light_n][2] = c[2];
  return;
}

Assistant:

void change_light(vec3 dir_list[], vec3 c_list[], int light_n, const vec3 dir, const vec3 c){
    dir_list[light_n][0] = dir[0];
    dir_list[light_n][1] = dir[1];
    dir_list[light_n][2] = dir[2];
    c_list[light_n][0] = c[0];
    c_list[light_n][1] = c[1];
    c_list[light_n][2] = c[2];
}